

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O1

size_t __thiscall ODDLParser::Reference::sizeInBytes(Reference *this)

{
  size_t sVar1;
  size_t i;
  size_t sVar2;
  
  if (this->m_numRefs != 0) {
    sVar2 = 0;
    sVar1 = 0;
    do {
      if (this->m_referencedName[sVar2] != (Name *)0x0) {
        sVar1 = sVar1 + this->m_referencedName[sVar2]->m_id->m_len;
      }
      sVar2 = sVar2 + 1;
    } while (this->m_numRefs != sVar2);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t Reference::sizeInBytes() {
    if ( 0 == m_numRefs ) {
        return 0;
    }

    size_t size( 0 );
    for ( size_t i = 0; i < m_numRefs; i++ ) {
        Name *name( m_referencedName[ i ] );
        if ( ddl_nullptr != name ) {
            size += name->m_id->m_len;
        }
    }

    return size;
}